

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O2

void __thiscall
slang::ast::FirstMatchAssertionExpr::serializeTo
          (FirstMatchAssertionExpr *this,ASTSerializer *serializer)

{
  pointer ppEVar1;
  size_type sVar2;
  long lVar3;
  string_view name;
  
  ASTSerializer::write(serializer,3,"seq",(size_t)this->seq);
  name._M_str = "matchItems";
  name._M_len = 10;
  ASTSerializer::startArray(serializer,name);
  ppEVar1 = (this->matchItems).data_;
  sVar2 = (this->matchItems).size_;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar1 + lVar3));
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void FirstMatchAssertionExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.write("seq", seq);

    serializer.startArray("matchItems");
    for (auto item : matchItems)
        serializer.serialize(*item);
    serializer.endArray();
}